

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogAdd(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_44;
  int n_replace;
  xmlChar *replace;
  int n_orig;
  xmlChar *orig;
  int n_type;
  xmlChar *type;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (orig._4_4_ = 0; (int)orig._4_4_ < 5; orig._4_4_ = orig._4_4_ + 1) {
    for (replace._4_4_ = 0; (int)replace._4_4_ < 5; replace._4_4_ = replace._4_4_ + 1) {
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_const_xmlChar_ptr(orig._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(replace._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_44,2);
        iVar2 = xmlCatalogAdd(val,val_00,val_01);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_const_xmlChar_ptr(orig._4_4_,val,0);
        des_const_xmlChar_ptr(replace._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogAdd",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)orig._4_4_);
          printf(" %d",(ulong)replace._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlCatalogAdd(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int mem_base;
    int ret_val;
    const xmlChar * type; /* the type of record to add to the catalog */
    int n_type;
    const xmlChar * orig; /* the system, public or prefix to match */
    int n_orig;
    const xmlChar * replace; /* the replacement value for the match */
    int n_replace;

    for (n_type = 0;n_type < gen_nb_const_xmlChar_ptr;n_type++) {
    for (n_orig = 0;n_orig < gen_nb_const_xmlChar_ptr;n_orig++) {
    for (n_replace = 0;n_replace < gen_nb_const_xmlChar_ptr;n_replace++) {
        mem_base = xmlMemBlocks();
        type = gen_const_xmlChar_ptr(n_type, 0);
        orig = gen_const_xmlChar_ptr(n_orig, 1);
        replace = gen_const_xmlChar_ptr(n_replace, 2);

        ret_val = xmlCatalogAdd(type, orig, replace);
        desret_int(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_type, type, 0);
        des_const_xmlChar_ptr(n_orig, orig, 1);
        des_const_xmlChar_ptr(n_replace, replace, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCatalogAdd",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_type);
            printf(" %d", n_orig);
            printf(" %d", n_replace);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}